

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_version_manager.cpp
# Opt level: O0

idx_t __thiscall
duckdb::RowVersionManager::GetCommittedDeletedCount(RowVersionManager *this,idx_t count)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  unsigned_long uVar4;
  pointer pCVar5;
  undefined4 extraout_var;
  ulong in_RSI;
  long in_RDI;
  idx_t max_count;
  idx_t i;
  idx_t r;
  idx_t deleted_count;
  lock_guard<std::mutex> l;
  mutex_type *in_stack_ffffffffffffff78;
  vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_true>
  *in_stack_ffffffffffffff80;
  ulong local_30;
  ulong local_28;
  idx_t local_20;
  
  ::std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  local_20 = 0;
  local_30 = 0;
  for (local_28 = 0; local_28 < in_RSI; local_28 = local_28 + 0x800) {
    sVar3 = ::std::
            vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>_>_>
            ::size((vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>_>_>
                    *)(in_RDI + 0x30));
    if (local_30 < sVar3) {
      vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_true>
      ::operator[](in_stack_ffffffffffffff80,(size_type)in_stack_ffffffffffffff78);
      bVar1 = ::std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_> *)
                         0xbab88f);
      if (bVar1) {
        uVar4 = MinValue<unsigned_long>(0x800,in_RSI - local_28);
        if (uVar4 == 0) break;
        vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_true>
        ::operator[](in_stack_ffffffffffffff80,(size_type)in_stack_ffffffffffffff78);
        pCVar5 = unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>::
                 operator->((unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>
                             *)in_stack_ffffffffffffff80);
        iVar2 = (*pCVar5->_vptr_ChunkInfo[6])(pCVar5,uVar4);
        in_stack_ffffffffffffff80 =
             (vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_true>
              *)CONCAT44(extraout_var,iVar2);
        local_20 = (long)&(in_stack_ffffffffffffff80->
                          super_vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>_>_>
                          ).
                          super__Vector_base<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + local_20;
      }
    }
    local_30 = local_30 + 1;
  }
  ::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0xbab971);
  return local_20;
}

Assistant:

idx_t RowVersionManager::GetCommittedDeletedCount(idx_t count) {
	lock_guard<mutex> l(version_lock);
	idx_t deleted_count = 0;
	for (idx_t r = 0, i = 0; r < count; r += STANDARD_VECTOR_SIZE, i++) {
		if (i >= vector_info.size() || !vector_info[i]) {
			continue;
		}
		idx_t max_count = MinValue<idx_t>(STANDARD_VECTOR_SIZE, count - r);
		if (max_count == 0) {
			break;
		}
		deleted_count += vector_info[i]->GetCommittedDeletedCount(max_count);
	}
	return deleted_count;
}